

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int removeNode(Rtree *pRtree,RtreeNode *pNode,int iHeight)

{
  int local_3c;
  RtreeNode *pRStack_38;
  int iCell;
  RtreeNode *pParent;
  int local_28;
  int rc2;
  int rc;
  int iHeight_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  pRStack_38 = (RtreeNode *)0x0;
  rc2 = iHeight;
  _rc = pNode;
  pNode_local = (RtreeNode *)pRtree;
  local_28 = nodeParentIndex(pRtree,pNode,&local_3c);
  if (local_28 == 0) {
    pRStack_38 = _rc->pParent;
    _rc->pParent = (RtreeNode *)0x0;
    local_28 = deleteCell((Rtree *)pNode_local,pRStack_38,local_3c,rc2 + 1);
  }
  pParent._4_4_ = nodeRelease((Rtree *)pNode_local,pRStack_38);
  if (local_28 == 0) {
    local_28 = pParent._4_4_;
  }
  if (local_28 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)pNode_local[3].iNode,1,_rc->iNode);
    sqlite3_step((sqlite3_stmt *)pNode_local[3].iNode);
    local_28 = sqlite3_reset((sqlite3_stmt *)pNode_local[3].iNode);
    pRtree_local._4_4_ = local_28;
    if (local_28 == 0) {
      sqlite3_bind_int64(*(sqlite3_stmt **)&pNode_local[4].nRef,1,_rc->iNode);
      sqlite3_step(*(sqlite3_stmt **)&pNode_local[4].nRef);
      local_28 = sqlite3_reset(*(sqlite3_stmt **)&pNode_local[4].nRef);
      pRtree_local._4_4_ = local_28;
      if (local_28 == 0) {
        nodeHashDelete((Rtree *)pNode_local,_rc);
        _rc->iNode = (long)rc2;
        _rc->pNext = *(RtreeNode **)&pNode_local[2].nRef;
        _rc->nRef = _rc->nRef + 1;
        *(RtreeNode **)&pNode_local[2].nRef = _rc;
        pRtree_local._4_4_ = 0;
      }
    }
  }
  else {
    pRtree_local._4_4_ = local_28;
  }
  return pRtree_local._4_4_;
}

Assistant:

static int removeNode(Rtree *pRtree, RtreeNode *pNode, int iHeight){
  int rc;
  int rc2;
  RtreeNode *pParent = 0;
  int iCell;

  assert( pNode->nRef==1 );

  /* Remove the entry in the parent cell. */
  rc = nodeParentIndex(pRtree, pNode, &iCell);
  if( rc==SQLITE_OK ){
    pParent = pNode->pParent;
    pNode->pParent = 0;
    rc = deleteCell(pRtree, pParent, iCell, iHeight+1);
  }
  rc2 = nodeRelease(pRtree, pParent);
  if( rc==SQLITE_OK ){
    rc = rc2;
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Remove the xxx_node entry. */
  sqlite3_bind_int64(pRtree->pDeleteNode, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteNode);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteNode)) ){
    return rc;
  }

  /* Remove the xxx_parent entry. */
  sqlite3_bind_int64(pRtree->pDeleteParent, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteParent);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteParent)) ){
    return rc;
  }
  
  /* Remove the node from the in-memory hash table and link it into
  ** the Rtree.pDeleted list. Its contents will be re-inserted later on.
  */
  nodeHashDelete(pRtree, pNode);
  pNode->iNode = iHeight;
  pNode->pNext = pRtree->pDeleted;
  pNode->nRef++;
  pRtree->pDeleted = pNode;

  return SQLITE_OK;
}